

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week12-app3.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  void *this;
  int local_f8;
  float local_f4;
  undefined1 local_f0 [8];
  TUPLE tpl;
  undefined1 local_a0 [8];
  Student s;
  allocator<char> local_41;
  undefined1 local_40 [8];
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  char **param_1_local;
  int param_0_local;
  
  local_40._0_4_ = 10;
  p.second.field_2._8_8_ = param_2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&p,"ten",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  Name::basic_string<std::allocator<char>>
            ((Name *)local_a0,"Ali",
             (allocator<char> *)
             (tpl.super__Tuple_impl<0UL,_Name,_Surname,_Gpa,_Age>.super__Head_base<0UL,_Name,_false>
              ._M_head_impl.super_String.field_2._M_local_buf + 0xf));
  tpl.super__Tuple_impl<0UL,_Name,_Surname,_Gpa,_Age>.super__Head_base<0UL,_Name,_false>.
  _M_head_impl.super_String.field_2._M_local_buf[0xd] = '\x01';
  std::allocator<char>::allocator();
  Surname::basic_string<std::allocator<char>>
            ((Surname *)((long)&s.name.super_String.field_2 + 8),"Kanik",
             (allocator<char> *)
             (tpl.super__Tuple_impl<0UL,_Name,_Surname,_Gpa,_Age>.super__Head_base<0UL,_Name,_false>
              ._M_head_impl.super_String.field_2._M_local_buf + 0xe));
  Gpa::Gpa((Gpa *)((long)&s.surname.super_String.field_2 + 8),4.0);
  Age::Age((Age *)((long)&s.surname.super_String.field_2 + 0xc),0x16);
  tpl.super__Tuple_impl<0UL,_Name,_Surname,_Gpa,_Age>.super__Head_base<0UL,_Name,_false>.
  _M_head_impl.super_String.field_2._M_local_buf[0xd] = '\0';
  std::allocator<char>::~allocator
            ((allocator<char> *)
             (tpl.super__Tuple_impl<0UL,_Name,_Surname,_Gpa,_Age>.super__Head_base<0UL,_Name,_false>
              ._M_head_impl.super_String.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             (tpl.super__Tuple_impl<0UL,_Name,_Surname,_Gpa,_Age>.super__Head_base<0UL,_Name,_false>
              ._M_head_impl.super_String.field_2._M_local_buf + 0xf));
  poVar1 = operator<<((ostream *)&std::cout,(Student *)local_a0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_a0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_f4 = 4.0;
  local_f8 = 0x16;
  std::tuple<Name,_Surname,_Gpa,_Age>::
  tuple<const_char_(&)[4],_const_char_(&)[6],_float,_int,_true,_true>
            ((tuple<Name,_Surname,_Gpa,_Age> *)local_f0,(char (*) [4])"Ali",(char (*) [6])"Kanik",
             &local_f4,&local_f8);
  this = (void *)std::ostream::operator<<(&std::cout,4);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::tuple<Name,_Surname,_Gpa,_Age>::~tuple((tuple<Name,_Surname,_Gpa,_Age> *)local_f0);
  Student::~Student((Student *)local_a0);
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Pair
            ((Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40);
  return 0;
}

Assistant:

int main(int, char* [])
{
    auto p = Pair<int, std::string>{10, "ten"};

    auto s = Student{"Ali", "Kanik", 4.0f, 22};
    std::cout << s << std::endl;
    std::cout << s.name << std::endl;

    using TUPLE = std::tuple<Name, Surname, Gpa, Age>;
    auto tpl = TUPLE("Ali", "Kanik", 4.0f, 22);
//    auto tpl = std::make_tuple("Ali", 4.0f, 22, 3.5f);

//    std::cout << "!" << is_tuple<Student>::value << std::endl;

    // get the number of dimensions of a TUPLE type at compile-time
    std::cout << std::tuple_size_v<TUPLE> << std::endl;

//    TypeDebug< std::tuple_element_t<3, TUPLE> > a;

//    std::cout << std::get<Surname>(tpl) << std::endl;
//    std::cout << std::get<2>(tpl) << std::endl;

    return 0;
}